

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O3

void build_dbxx(m68k_info *info,int opcode,int size,int displacement)

{
  byte bVar1;
  
  MCInst_setOpcode(info->inst,opcode);
  (info->extension).op_count = '\x02';
  (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
  (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x0;
  (info->extension).operands[0].address_mode = M68K_AM_REG_DIRECT_DATA;
  (info->extension).operands[0].field_0.reg = (info->ir & 7) + M68K_REG_D0;
  (info->extension).operands[1].type = M68K_OP_BR_DISP;
  (info->extension).operands[1].address_mode = M68K_AM_BRANCH_DISPLACEMENT;
  (info->extension).operands[1].br_disp.disp = size;
  (info->extension).operands[1].br_disp.disp_size = '\x04';
  bVar1 = info->groups_count;
  info->groups_count = bVar1 + 1;
  info->groups[bVar1] = '\x01';
  bVar1 = info->groups_count;
  info->groups_count = bVar1 + 1;
  info->groups[bVar1] = '\a';
  return;
}

Assistant:

static void build_dbxx(m68k_info *info, int opcode, int size, int displacement)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, opcode, 2, size);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	op0->address_mode = M68K_AM_REG_DIRECT_DATA;
	op0->reg = M68K_REG_D0 + (info->ir & 7);

	op1->type = M68K_OP_BR_DISP;
	op1->address_mode = M68K_AM_BRANCH_DISPLACEMENT;
	op1->br_disp.disp = displacement;
	op1->br_disp.disp_size = M68K_OP_BR_DISP_SIZE_LONG;

	set_insn_group(info, M68K_GRP_JUMP);
	set_insn_group(info, M68K_GRP_BRANCH_RELATIVE);
}